

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall
mkvparser::CuePoint::TrackPosition::Parse
          (TrackPosition *this,IMkvReader *pReader,longlong start_,longlong size_)

{
  longlong lVar1;
  long *len_00;
  longlong lVar2;
  long size_00;
  IMkvReader *in_RCX;
  long in_RDX;
  IMkvReader *in_RSI;
  long *in_RDI;
  longlong size;
  longlong id;
  long len;
  longlong pos;
  longlong stop;
  long local_40;
  long pos_00;
  long pos_01;
  bool local_1;
  
  pos_00 = (long)&in_RCX->_vptr_IMkvReader + in_RDX;
  *in_RDI = -1;
  in_RDI[1] = -1;
  in_RDI[2] = 1;
  pos_01 = in_RDX;
  while( true ) {
    if (pos_00 <= in_RDX) {
      if ((((in_RDI[1] < 0) || (*in_RDI < 1)) || (in_RDI[2] < 0)) ||
         (0x7fffffffffffffff < in_RDI[2])) {
        local_1 = false;
      }
      else {
        local_1 = true;
      }
      return local_1;
    }
    lVar1 = ReadID(in_RSI,pos_01,(long *)in_RCX);
    if ((lVar1 < 0) || (pos_00 < in_RDX + local_40)) break;
    len_00 = (long *)(local_40 + in_RDX);
    lVar2 = ReadUInt(in_RCX,pos_00,len_00);
    if ((lVar2 < 0) || (pos_00 < (long)len_00 + local_40)) {
      return false;
    }
    size_00 = local_40 + (long)len_00;
    if (pos_00 < size_00 + lVar2) {
      return false;
    }
    if (lVar1 == 0xf7) {
      lVar1 = UnserializeUInt(in_RCX,pos_00,size_00);
      *in_RDI = lVar1;
    }
    else if (lVar1 == 0xf1) {
      lVar1 = UnserializeUInt(in_RCX,pos_00,size_00);
      in_RDI[1] = lVar1;
    }
    else if (lVar1 == 0x5378) {
      lVar1 = UnserializeUInt(in_RCX,pos_00,size_00);
      in_RDI[2] = lVar1;
    }
    in_RDX = lVar2 + size_00;
  }
  return false;
}

Assistant:

bool CuePoint::TrackPosition::Parse(IMkvReader* pReader, long long start_,
                                    long long size_) {
  const long long stop = start_ + size_;
  long long pos = start_;

  m_track = -1;
  m_pos = -1;
  m_block = 1;  // default

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if ((id < 0) || ((pos + len) > stop)) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if ((size < 0) || ((pos + len) > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if ((pos + size) > stop) {
      return false;
    }

    if (id == libwebm::kMkvCueTrack)
      m_track = UnserializeUInt(pReader, pos, size);
    else if (id == libwebm::kMkvCueClusterPosition)
      m_pos = UnserializeUInt(pReader, pos, size);
    else if (id == libwebm::kMkvCueBlockNumber)
      m_block = UnserializeUInt(pReader, pos, size);

    pos += size;  // consume payload
  }

  if ((m_pos < 0) || (m_track <= 0) || (m_block < 0) || (m_block > LONG_MAX)) {
    return false;
  }

  return true;
}